

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxColorLiteral::Resolve(FxColorLiteral *this,FCompileContext *ctx)

{
  uint uVar1;
  int iVar2;
  FxExpression **ppFVar3;
  undefined4 extraout_var;
  FxColorLiteral *this_00;
  bool bVar4;
  FxConstant *x;
  undefined1 local_48 [28];
  int i;
  EFxType local_24;
  PType *pPStack_20;
  uint constelements;
  FCompileContext *ctx_local;
  FxColorLiteral *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    local_24 = EFX_Expression;
    pPStack_20 = (PType *)ctx;
    ctx_local = (FCompileContext *)this;
    uVar1 = TArray<FxExpression_*,_FxExpression_*>::Size
                      (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
    bVar4 = true;
    if (uVar1 != 3) {
      uVar1 = TArray<FxExpression_*,_FxExpression_*>::Size
                        (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
      bVar4 = uVar1 == 4;
    }
    if (!bVar4) {
      __assert_fail("ArgList.Size() == 3 || ArgList.Size() == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x20ce,"virtual FxExpression *FxColorLiteral::Resolve(FCompileContext &)");
    }
    uVar1 = TArray<FxExpression_*,_FxExpression_*>::Size
                      (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>);
    if (uVar1 == 3) {
      stack0xffffffffffffffd0 = (PType *)0x0;
      ctx = (FCompileContext *)0x0;
      TArray<FxExpression_*,_FxExpression_*>::Insert
                (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,0,
                 (FxExpression **)(local_48 + 0x18));
    }
    for (local_48._20_4_ = 0; (int)local_48._20_4_ < 4; local_48._20_4_ = local_48._20_4_ + 1) {
      ctx = (FCompileContext *)(long)(int)local_48._20_4_;
      ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,(size_t)ctx
                          );
      if (*ppFVar3 == (FxExpression *)0x0) {
        local_24 = local_24 + EFX_Identifier;
      }
      else {
        ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                             (long)(int)local_48._20_4_);
        if (*ppFVar3 != (FxExpression *)0x0) {
          ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                               (long)(int)local_48._20_4_);
          iVar2 = (*(*ppFVar3)->_vptr_FxExpression[2])(*ppFVar3,pPStack_20);
          ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                               (long)(int)local_48._20_4_);
          *ppFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
        }
        ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                             (long)(int)local_48._20_4_);
        if (*ppFVar3 == (FxExpression *)0x0) {
          if (this != (FxColorLiteral *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
        ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                             (long)(int)local_48._20_4_);
        bVar4 = FxExpression::IsInteger(*ppFVar3);
        if (!bVar4) {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "Integer expected for color component");
          if (this != (FxColorLiteral *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
        ctx = (FCompileContext *)(long)(int)local_48._20_4_;
        ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                             (size_t)ctx);
        uVar1 = (*(*ppFVar3)->_vptr_FxExpression[3])();
        if ((uVar1 & 1) != 0) {
          TArray<FxExpression_*,_FxExpression_*>::operator[]
                    (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                     (long)(int)local_48._20_4_);
          FxConstant::GetValue((FxConstant *)local_48);
          iVar2 = ExpVal::GetInt((ExpVal *)local_48);
          iVar2 = clamp<int>(iVar2,0,0xff);
          this->constval = (iVar2 << (0x18U - (char)(local_48._20_4_ << 3) & 0x1f)) + this->constval
          ;
          ExpVal::~ExpVal((ExpVal *)local_48);
          ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                               (long)(int)local_48._20_4_);
          if (*ppFVar3 != (FxExpression *)0x0) {
            (*(*ppFVar3)->_vptr_FxExpression[1])();
          }
          ctx = (FCompileContext *)(long)(int)local_48._20_4_;
          ppFVar3 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
                               (size_t)ctx);
          *ppFVar3 = (FxExpression *)0x0;
          local_24 = local_24 + EFX_Identifier;
        }
      }
    }
    if (local_24 == EFX_Constant) {
      this_00 = (FxColorLiteral *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
      FxConstant::FxConstant
                ((FxConstant *)this_00,this->constval,&(this->super_FxExpression).ScriptPosition);
      (this_00->super_FxExpression).ValueType = (PType *)TypeColor;
      this_local = this_00;
      if (this != (FxColorLiteral *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
    }
    else {
      (this->super_FxExpression).ValueType = (PType *)TypeColor;
      this_local = this;
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxColorLiteral::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	unsigned constelements = 0;
	assert(ArgList.Size() == 3 || ArgList.Size() == 4);
	if (ArgList.Size() == 3) ArgList.Insert(0, nullptr);
	for (int i = 0; i < 4; i++)
	{
		if (ArgList[i] != nullptr)
		{
			SAFE_RESOLVE(ArgList[i], ctx);
			if (!ArgList[i]->IsInteger())
			{
				ScriptPosition.Message(MSG_ERROR, "Integer expected for color component");
				delete this;
				return nullptr;
			}
			if (ArgList[i]->isConstant())
			{
				constval += clamp(static_cast<FxConstant *>(ArgList[i])->GetValue().GetInt(), 0, 255) << (24 - i * 8);
				delete ArgList[i];
				ArgList[i] = nullptr;
				constelements++;
			}
		}
		else constelements++;
	}
	if (constelements == 4)
	{
		auto x = new FxConstant(constval, ScriptPosition);
		x->ValueType = TypeColor;
		delete this;
		return x;
	}
	ValueType = TypeColor;
	return this;
}